

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::emit_continue_block_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t continue_block,
          bool follow_true_block,bool follow_false_block)

{
  BlockID BVar1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar2;
  size_type sVar3;
  string *psVar4;
  SPIRBlock *block;
  CompilerError *this_00;
  long lVar5;
  BlockID *pBVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  allocator local_171;
  string *local_170;
  string local_168;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  statements;
  
  local_170 = __return_storage_ptr__;
  block = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,continue_block);
  this->current_continue_block = block;
  statements.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &statements.stack_storage;
  statements.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  statements.buffer_capacity = 8;
  pSVar2 = this->redirect_statement;
  this->redirect_statement = &statements;
  do {
    if (((this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>.ptr
         [(block->super_IVariant).self.id] & 1) != 0) {
      this->redirect_statement = pSVar2;
      pbVar7 = statements.
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .ptr;
      for (lVar5 = statements.
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .buffer_size << 5; psVar4 = local_170, lVar5 != 0; lVar5 = lVar5 + -0x20) {
        sVar3 = pbVar7->_M_string_length;
        if ((sVar3 != 0) && ((pbVar7->_M_dataplus)._M_p[sVar3 - 1] == ';')) {
          ::std::__cxx11::string::erase((ulong)pbVar7,sVar3 - 1);
        }
        pbVar7 = pbVar7 + 1;
      }
      this->current_continue_block = (SPIRBlock *)0x0;
      merge(local_170,&statements,", ");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector(&statements);
      return psVar4;
    }
    emit_block_instructions(this,block);
    BVar1.id = (block->next_block).id;
    if (BVar1.id == 0) {
      BVar1.id = (block->true_block).id;
      if (BVar1.id == 0 || !follow_true_block) {
        BVar1.id = (block->false_block).id;
        if ((BVar1.id == 0) || (!follow_false_block)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_168,"Invalid continue block detected!",&local_171);
          CompilerError::CompilerError(this_00,&local_168);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        flush_phi(this,(BlockID)continue_block,BVar1);
        pBVar6 = &block->false_block;
      }
      else {
        flush_phi(this,(BlockID)continue_block,BVar1);
        pBVar6 = &block->true_block;
      }
    }
    else {
      flush_phi(this,(BlockID)continue_block,BVar1);
      pBVar6 = &block->next_block;
    }
    block = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,pBVar6->id);
  } while( true );
}

Assistant:

string CompilerGLSL::emit_continue_block(uint32_t continue_block, bool follow_true_block, bool follow_false_block)
{
	auto *block = &get<SPIRBlock>(continue_block);

	// While emitting the continue block, declare_temporary will check this
	// if we have to emit temporaries.
	current_continue_block = block;

	SmallVector<string> statements;

	// Capture all statements into our list.
	auto *old = redirect_statement;
	redirect_statement = &statements;

	// Stamp out all blocks one after each other.
	while ((ir.block_meta[block->self] & ParsedIR::BLOCK_META_LOOP_HEADER_BIT) == 0)
	{
		// Write out all instructions we have in this block.
		emit_block_instructions(*block);

		// For plain branchless for/while continue blocks.
		if (block->next_block)
		{
			flush_phi(continue_block, block->next_block);
			block = &get<SPIRBlock>(block->next_block);
		}
		// For do while blocks. The last block will be a select block.
		else if (block->true_block && follow_true_block)
		{
			flush_phi(continue_block, block->true_block);
			block = &get<SPIRBlock>(block->true_block);
		}
		else if (block->false_block && follow_false_block)
		{
			flush_phi(continue_block, block->false_block);
			block = &get<SPIRBlock>(block->false_block);
		}
		else
		{
			SPIRV_CROSS_THROW("Invalid continue block detected!");
		}
	}

	// Restore old pointer.
	redirect_statement = old;

	// Somewhat ugly, strip off the last ';' since we use ',' instead.
	// Ideally, we should select this behavior in statement().
	for (auto &s : statements)
	{
		if (!s.empty() && s.back() == ';')
			s.erase(s.size() - 1, 1);
	}

	current_continue_block = nullptr;
	return merge(statements);
}